

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2cod.c
# Opt level: O2

int jpc_pchglist_insert(jpc_pchglist_t *pchglist,int pchgno,jpc_pchg_t *pchg)

{
  int iVar1;
  jpc_pchg_t **ppjVar2;
  long lVar3;
  size_t num_elements;
  
  iVar1 = pchglist->numpchgs;
  if (pchgno < 0) {
    pchgno = iVar1;
  }
  if (pchglist->maxpchgs <= iVar1) {
    num_elements = (long)pchglist->maxpchgs + 0x80;
    ppjVar2 = (jpc_pchg_t **)jas_realloc2(pchglist->pchgs,num_elements,8);
    if (ppjVar2 == (jpc_pchg_t **)0x0) {
      return -1;
    }
    pchglist->maxpchgs = (int)num_elements;
    pchglist->pchgs = ppjVar2;
    iVar1 = pchglist->numpchgs;
  }
  for (lVar3 = (long)iVar1; ppjVar2 = pchglist->pchgs, pchgno < lVar3; lVar3 = lVar3 + -1) {
    ppjVar2[lVar3] = ppjVar2[lVar3 + -1];
  }
  ppjVar2[pchgno] = pchg;
  pchglist->numpchgs = iVar1 + 1;
  return 0;
}

Assistant:

int jpc_pchglist_insert(jpc_pchglist_t *pchglist, int pchgno, jpc_pchg_t *pchg)
{
	int i;
	int newmaxpchgs;
	jpc_pchg_t **newpchgs;
	if (pchgno < 0) {
		pchgno = pchglist->numpchgs;
	}
	if (pchglist->numpchgs >= pchglist->maxpchgs) {
		newmaxpchgs = pchglist->maxpchgs + 128;
		if (!(newpchgs = jas_realloc2(pchglist->pchgs, newmaxpchgs,
		  sizeof(jpc_pchg_t *)))) {
			return -1;
		}
		pchglist->maxpchgs = newmaxpchgs;
		pchglist->pchgs = newpchgs;
	}
	for (i = pchglist->numpchgs; i > pchgno; --i) {
		pchglist->pchgs[i] = pchglist->pchgs[i - 1];
	}
	pchglist->pchgs[pchgno] = pchg;
	++pchglist->numpchgs;
	return 0;
}